

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

int __thiscall jpgd::jpeg_decoder::huff_decode(jpeg_decoder *this,huff_tables *pH)

{
  int iVar1;
  uint uVar2;
  long in_RSI;
  jpeg_decoder *in_RDI;
  uint idx;
  int ofs;
  int symbol;
  jpgd_status in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int local_18;
  int local_14;
  
  if (in_RSI == 0) {
    stop_decoding((jpeg_decoder *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                  in_stack_ffffffffffffffcc);
  }
  local_14 = *(int *)(in_RSI + 4 + (ulong)(in_RDI->m_bit_buf >> 0x18) * 4);
  if (local_14 < 0) {
    local_18 = 0x17;
    iVar1 = local_14;
    do {
      local_14 = iVar1;
      uVar2 = -(local_14 + (in_RDI->m_bit_buf >> ((byte)local_18 & 0x1f) & 1));
      if ((0x1ff < uVar2) || (local_18 < 0)) {
        stop_decoding((jpeg_decoder *)CONCAT44(local_14,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffcc);
      }
      iVar1 = *(int *)(in_RSI + 0x904 + (ulong)uVar2 * 4);
      local_18 = local_18 + -1;
    } while (iVar1 < 0);
    get_bits_no_markers(in_RDI,local_14);
    local_14 = iVar1;
  }
  else {
    if (0xff < local_14) {
      __assert_fail("symbol < JPGD_HUFF_CODE_SIZE_MAX_LENGTH",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/jpgd.cpp"
                    ,0x207,"int jpgd::jpeg_decoder::huff_decode(huff_tables *)");
    }
    get_bits_no_markers(in_RDI,in_stack_ffffffffffffffd4);
  }
  return local_14;
}

Assistant:

inline int jpeg_decoder::huff_decode(huff_tables* pH)
	{
		if (!pH)
			stop_decoding(JPGD_DECODE_ERROR);

		int symbol;
		// Check first 8-bits: do we have a complete symbol?
		if ((symbol = pH->look_up[m_bit_buf >> 24]) < 0)
		{
			// Decode more bits, use a tree traversal to find symbol.
			int ofs = 23;
			do
			{
				unsigned int idx = -(int)(symbol + ((m_bit_buf >> ofs) & 1));

				// This should never happen, but to be safe I'm turning these asserts into a run-time check.
				if ((idx >= JPGD_HUFF_TREE_MAX_LENGTH) || (ofs < 0))
					stop_decoding(JPGD_DECODE_ERROR);

				symbol = pH->tree[idx];
				ofs--;
			} while (symbol < 0);

			get_bits_no_markers(8 + (23 - ofs));
		}
		else
		{
			assert(symbol < JPGD_HUFF_CODE_SIZE_MAX_LENGTH);
			get_bits_no_markers(pH->code_size[symbol]);
		}

		return symbol;
	}